

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronous_factory.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::synchronous_factory::
create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
          (string *logger_name,color_mode *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_> *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  shared_ptr<spdlog::logger> *in_stack_00000028;
  registry *in_stack_00000030;
  shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_> sink;
  shared_ptr<spdlog::logger> *new_logger;
  shared_ptr<spdlog::logger> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<spdlog::logger> local_50 [2];
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  __args = &local_28;
  std::
  make_shared<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            ((color_mode *)__args);
  local_29 = 0;
  std::
  make_shared<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>>>
            (__args,in_RSI);
  details::registry::instance();
  CLI::std::shared_ptr<spdlog::logger>::shared_ptr(local_50,in_stack_ffffffffffffff78);
  details::registry::initialize_logger(in_stack_00000030,in_stack_00000028);
  CLI::std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x6d9635);
  local_29 = 1;
  std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_>::
  ~shared_ptr((shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>_>
               *)0x6d9691);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<spdlog::logger> create(std::string logger_name, SinkArgs &&...args) {
        auto sink = std::make_shared<Sink>(std::forward<SinkArgs>(args)...);
        auto new_logger = std::make_shared<spdlog::logger>(std::move(logger_name), std::move(sink));
        details::registry::instance().initialize_logger(new_logger);
        return new_logger;
    }